

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_chacha20poly1305.cc
# Opt level: O1

int aead_chacha20_poly1305_init(EVP_AEAD_CTX *ctx,uint8_t *key,size_t key_len,size_t tag_len)

{
  uint64_t uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  int iVar5;
  
  uVar4 = 0x10;
  if (tag_len != 0) {
    uVar4 = tag_len;
  }
  if (uVar4 < 0x11) {
    iVar5 = 0;
    if (key_len == 0x20) {
      uVar1 = *(uint64_t *)key;
      uVar2 = *(undefined8 *)(key + 8);
      uVar3 = *(undefined8 *)(key + 0x18);
      *(undefined8 *)((long)&ctx->state + 0x10) = *(undefined8 *)(key + 0x10);
      *(undefined8 *)((long)&ctx->state + 0x18) = uVar3;
      (ctx->state).alignment = uVar1;
      *(undefined8 *)((long)&ctx->state + 8) = uVar2;
      ctx->tag_len = (uint8_t)uVar4;
      iVar5 = 1;
    }
  }
  else {
    iVar5 = 0;
    ERR_put_error(0x1e,0,0x75,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_chacha20poly1305.cc"
                  ,0x34);
  }
  return iVar5;
}

Assistant:

static int aead_chacha20_poly1305_init(EVP_AEAD_CTX *ctx, const uint8_t *key,
                                       size_t key_len, size_t tag_len) {
  struct aead_chacha20_poly1305_ctx *c20_ctx =
      (struct aead_chacha20_poly1305_ctx *)&ctx->state;

  if (tag_len == 0) {
    tag_len = POLY1305_TAG_LEN;
  }

  if (tag_len > POLY1305_TAG_LEN) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_TOO_LARGE);
    return 0;
  }

  if (key_len != sizeof(c20_ctx->key)) {
    return 0;  // internal error - EVP_AEAD_CTX_init should catch this.
  }

  OPENSSL_memcpy(c20_ctx->key, key, key_len);
  ctx->tag_len = tag_len;

  return 1;
}